

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O0

int __thiscall sc_core::sc_phash_base::insert_if_not_exists(sc_phash_base *this,void *k,void *c)

{
  uint uVar1;
  sc_phash_elem *psVar2;
  undefined8 in_RDX;
  uint hv;
  sc_phash_base *in_RSI;
  void *in_RDI;
  sc_phash_base *unaff_retaddr;
  sc_phash_elem *ptr;
  uint hash_val;
  sc_phash_base *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  hv = (uint)((ulong)in_RDX >> 0x20);
  uVar1 = do_hash(in_stack_ffffffffffffffd0,in_RDI);
  psVar2 = find_entry(in_RSI,hv,(void *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                      (sc_phash_elem ***)in_stack_ffffffffffffffd0);
  if (psVar2 == (sc_phash_elem *)0x0) {
    add_direct(unaff_retaddr,(void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               in_RDI,(uint)((ulong)in_RSI >> 0x20));
  }
  return (uint)(psVar2 != (sc_phash_elem *)0x0);
}

Assistant:

int
sc_phash_base::insert_if_not_exists( void* k, void* c )
{
    unsigned hash_val = do_hash(k);
    sc_phash_elem* ptr = find_entry( hash_val, k );
    if (ptr == 0) {
        (void) add_direct( k, c, hash_val );
        return 0;
    }
    else
        return 1;
}